

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keno_HotAndCold.cpp
# Opt level: O0

void __thiscall
Keno_HotAndCold::infoHotAndCold
          (Keno_HotAndCold *this,vector<int,_std::allocator<int>_> *generate20Numbers)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  pair<int,_int> local_30;
  int local_28;
  int local_24;
  int j;
  int i_1;
  int i;
  int currNumber;
  vector<int,_std::allocator<int>_> *generate20Numbers_local;
  Keno_HotAndCold *this_local;
  
  i_1 = 0;
  j = 0;
  _i = generate20Numbers;
  generate20Numbers_local = &this->_vectorTo80Nums;
  while( true ) {
    uVar2 = (ulong)j;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(_i);
    if (sVar3 <= uVar2) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](_i,(long)j);
    std::vector<int,_std::allocator<int>_>::push_back(&saveGeneratedNumbers,pvVar4);
    j = j + 1;
  }
  local_24 = 0;
  while( true ) {
    uVar2 = (ulong)local_24;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&saveGeneratedNumbers);
    if (sVar3 <= uVar2) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&saveGeneratedNumbers,(long)local_24);
    i_1 = *pvVar4;
    local_28 = 1;
    while( true ) {
      uVar2 = (ulong)local_28;
      sVar3 = std::vector<int,_std::allocator<int>_>::size(&saveGeneratedNumbers);
      if (sVar3 <= uVar2) break;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&saveGeneratedNumbers,(long)local_24);
      iVar1 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&saveGeneratedNumbers,(long)local_28);
      if (iVar1 == *pvVar4) {
        count = count + 1;
      }
      local_28 = local_28 + 1;
    }
    std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_30,&i_1,&count);
    std::multimap<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>::
    insert<std::pair<int,int>>
              ((multimap<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>> *)&hot,
               &local_30);
    count = 0;
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Keno_HotAndCold::infoHotAndCold(std::vector<int> &generate20Numbers) {
	int currNumber = 0;
	
	for (int i = 0; i < generate20Numbers.size(); ++i) {
		saveGeneratedNumbers.push_back(generate20Numbers[i]);
	}

	for (int i = 0; i < saveGeneratedNumbers.size(); ++i) {
		currNumber = saveGeneratedNumbers[i];
		for (int j = 1; j < saveGeneratedNumbers.size(); ++j) {
			if (saveGeneratedNumbers[i] == saveGeneratedNumbers[j]) {
				count++;
			}
		}
		hot.insert(std::pair<int, int>(currNumber, count));
		count = 0;
	}

	
	/*for (auto it = hot1.begin(); it != hot1.end(); ++it) {
		std::cout << it->first << " " << it->second << std::endl;
	}*/

	//int countHot = 0;
	//int number = 0;;
	//std::cout << "Hot Numbers: ";
	//for (auto it = hot.begin(); it != hot.end(); ++it) {
	//	
	//	for (auto it1 = it++; it1 != hot.end(); ++it1) {
	//		if (it->second < it1->second && it->first<=it1->first) { // count
	//			number = it1->first;
	//		}
	//		else {
	//			number = it -> first;
	//		}
	//	}
	//	printGeneratedNumbers.push_back(number);
	//}

	//int counter1 = 0;
	//for (size_t i = printGeneratedNumbers.size(); i >= 5 ; --i) {
	//	if (counter1 == 5) {
	//		break;
	//	}
	//	std::cout << printGeneratedNumbers[i] << " ";
	//}
	//count++;
	//std::cout << std::endl;
}